

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.capnp.h
# Opt level: O2

Builder * __thiscall
capnp::schema::Field::Builder::initSlot(Builder *__return_storage_ptr__,Builder *this)

{
  void *pvVar1;
  SegmentBuilder *pSVar2;
  CapTableBuilder *pCVar3;
  WirePointer *pWVar4;
  StructPointerCount SVar5;
  undefined2 uVar6;
  PointerBuilder local_38;
  
  pvVar1 = (this->_builder).data;
  *(undefined2 *)((long)pvVar1 + 8) = 0;
  *(undefined4 *)((long)pvVar1 + 4) = 0;
  *(byte *)((long)pvVar1 + 0x10) = *(byte *)((long)pvVar1 + 0x10) & 0xfe;
  local_38.pointer = (this->_builder).pointers + 2;
  local_38.segment = (this->_builder).segment;
  local_38.capTable = (this->_builder).capTable;
  capnp::_::PointerBuilder::clear(&local_38);
  local_38.pointer = (this->_builder).pointers + 3;
  local_38.segment = (this->_builder).segment;
  local_38.capTable = (this->_builder).capTable;
  capnp::_::PointerBuilder::clear(&local_38);
  SVar5 = (this->_builder).pointerCount;
  uVar6 = *(undefined2 *)&(this->_builder).field_0x26;
  (__return_storage_ptr__->_builder).dataSize = (this->_builder).dataSize;
  (__return_storage_ptr__->_builder).pointerCount = SVar5;
  *(undefined2 *)&(__return_storage_ptr__->_builder).field_0x26 = uVar6;
  pSVar2 = (this->_builder).segment;
  pCVar3 = (this->_builder).capTable;
  pWVar4 = (this->_builder).pointers;
  (__return_storage_ptr__->_builder).data = (this->_builder).data;
  (__return_storage_ptr__->_builder).pointers = pWVar4;
  (__return_storage_ptr__->_builder).segment = pSVar2;
  (__return_storage_ptr__->_builder).capTable = pCVar3;
  return __return_storage_ptr__;
}

Assistant:

inline typename Field::Slot::Builder Field::Builder::initSlot() {
  _builder.setDataField<Field::Which>(
      ::capnp::bounded<4>() * ::capnp::ELEMENTS, Field::SLOT);
  _builder.setDataField< ::uint32_t>(::capnp::bounded<1>() * ::capnp::ELEMENTS, 0);
  _builder.setDataField<bool>(::capnp::bounded<128>() * ::capnp::ELEMENTS, 0);
  _builder.getPointerField(::capnp::bounded<2>() * ::capnp::POINTERS).clear();
  _builder.getPointerField(::capnp::bounded<3>() * ::capnp::POINTERS).clear();
  return typename Field::Slot::Builder(_builder);
}